

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

void traverse_itree_fast<float,int>
               (vector<IsoTree,_std::allocator<IsoTree>_> *tree,IsoForest *model_outputs,
               float *row_numeric_data,double *output_depth,int *tree_num,double *tree_depth,
               size_t row)

{
  double dVar1;
  pointer pIVar2;
  pointer pIVar3;
  size_t sVar4;
  size_t *psVar5;
  size_t *psVar6;
  
  pIVar2 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar3 = pIVar2;
  if (pIVar2->tree_left == 0) {
    sVar4 = 0;
  }
  else {
    psVar6 = &pIVar2->tree_left;
    do {
      psVar5 = &pIVar3->tree_right;
      if ((double)row_numeric_data[pIVar3->col_num] <= pIVar3->num_split) {
        psVar5 = psVar6;
      }
      sVar4 = *psVar5;
      pIVar3 = pIVar2 + sVar4;
      psVar6 = &pIVar2[sVar4].tree_left;
    } while (*psVar6 != 0);
  }
  dVar1 = pIVar3->score;
  *output_depth = *output_depth + dVar1;
  if (tree_num != (int *)0x0) {
    tree_num[row] = (int)sVar4;
  }
  if (tree_depth != (double *)0x0) {
    *tree_depth = dVar1;
    return;
  }
  return;
}

Assistant:

void traverse_itree_fast(std::vector<IsoTree>  &tree,
                         IsoForest             &model_outputs,
                         real_t *restrict      row_numeric_data,
                         double &restrict      output_depth,
                         sparse_ix *restrict   tree_num,
                         double *restrict      tree_depth,
                         size_t                row) noexcept
{
    size_t curr_lev = 0;
    double xval;
    while (true)
    {
        if (unlikely(tree[curr_lev].tree_left == 0))
        {
            output_depth += tree[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = tree[curr_lev].score;
            break;
        }

        else
        {
            xval     = row_numeric_data[tree[curr_lev].col_num];
            curr_lev = (xval <= tree[curr_lev].num_split)?
                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
        }
    }
}